

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O2

object * primitive(int primitiveNumber,object *args,int *failed)

{
  uchar *to;
  byte bVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int64_t val;
  object *poVar6;
  __int32_t **pp_Var7;
  void *pvVar8;
  uint *puVar9;
  FILE *pFVar10;
  object *poVar11;
  size_t sVar12;
  object **ppoVar13;
  ssize_t sVar14;
  int *piVar15;
  char cVar16;
  ulong uVar17;
  int iVar18;
  FILE **ppFVar19;
  long lVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  char *pcVar27;
  char *pcVar28;
  char *pcVar29;
  char *pcVar30;
  char *pcVar31;
  char *pcVar32;
  char *pcVar33;
  char *pcVar34;
  int index;
  long lVar35;
  ushort uVar36;
  ulong uVar37;
  int iVar38;
  long lVar39;
  ulong uVar40;
  char acStack_80 [8];
  undefined1 local_78 [8];
  sockaddr_in sin;
  char netBuffer [18];
  in_addr local_44;
  int iStack_40;
  in_addr iaddr;
  
  poVar11 = nilObject;
  *failed = 0;
  switch(primitiveNumber) {
  case 100:
    poVar6 = (object *)args[1].header;
    uVar4 = (uint)poVar6->header >> 2;
    pcVar21 = local_78 + -(ulong)(uVar4 + 0x10 & 0xfffffff0);
    uVar3 = (uint)(args[1].class)->header >> 2;
    pcVar22 = pcVar21 + -(ulong)(uVar3 + 0x10 & 0xfffffff0);
    pcVar22[-8] = -0x42;
    pcVar22[-7] = 'l';
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    getUnixString(pcVar21,uVar4 + 1,poVar6);
    poVar6 = args[1].class;
    pcVar22[-8] = -0x33;
    pcVar22[-7] = 'l';
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    getUnixString(pcVar22,uVar3 + 1,poVar6);
    pcVar22[-8] = -0x28;
    pcVar22[-7] = 'l';
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    pFVar10 = fopen(pcVar21,pcVar22);
    if (pFVar10 == (FILE *)0x0) {
      *failed = 1;
      return poVar11;
    }
    ppFVar19 = filePointers;
    pcVar22[-8] = '\x01';
    pcVar22[-7] = '\0';
    pcVar22[-6] = '\0';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    poVar6 = *(object **)(pcVar22 + -8);
    while( true ) {
      if (poVar6 == (object *)0x191) {
        pcVar22[-8] = 'a';
        pcVar22[-7] = '\0';
        pcVar22[-6] = '\0';
        pcVar22[-5] = '\0';
        pcVar22[-4] = '\0';
        pcVar22[-3] = '\0';
        pcVar22[-2] = '\0';
        pcVar22[-1] = '\0';
        uVar2 = *(undefined8 *)(pcVar22 + -8);
        pcVar22[-8] = -100;
        pcVar22[-7] = 'v';
        pcVar22[-6] = '\x10';
        pcVar22[-5] = '\0';
        pcVar22[-4] = '\0';
        pcVar22[-3] = '\0';
        pcVar22[-2] = '\0';
        pcVar22[-1] = '\0';
        error_impl("primitive",(int)uVar2,"too many open files");
        return poVar11;
      }
      if (*ppFVar19 == (FILE *)0x0) break;
      ppFVar19 = ppFVar19 + 1;
      poVar6 = (object *)((long)&poVar6->header + 2);
    }
    *ppFVar19 = (FILE *)pFVar10;
    return poVar6;
  case 0x65:
    uVar40 = args[1].header >> 1;
    if (((uint)uVar40 < 200) && ((FILE *)filePointers[uVar40 & 0xff] != (FILE *)0x0)) {
      builtin_strncpy(acStack_80,"\x03r\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      uVar4 = fgetc((FILE *)filePointers[uVar40 & 0xff]);
      if (uVar4 == 0xffffffff) {
        return poVar11;
      }
      goto LAB_0010780f;
    }
    break;
  case 0x66:
    uVar40 = args[1].header >> 1;
    if (((uint)uVar40 < 200) && ((FILE *)filePointers[uVar40 & 0xff] != (FILE *)0x0)) {
      builtin_strncpy(acStack_80,";q\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      fputc((int)((ulong)args[1].class >> 1),(FILE *)filePointers[uVar40 & 0xff]);
      return poVar11;
    }
    break;
  case 0x67:
    uVar40 = args[1].header >> 1;
    if (((uint)uVar40 < 200) && ((FILE *)filePointers[uVar40 & 0xff] != (FILE *)0x0)) {
      builtin_strncpy(acStack_80,"nq\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      fclose((FILE *)filePointers[uVar40 & 0xff]);
      return poVar11;
    }
    break;
  case 0x68:
    uVar40 = args[1].header >> 1;
    if (((uint)uVar40 < 200) && (filePointers[uVar40 & 0xff] != (FILE *)0x0)) {
      builtin_strncpy(acStack_80,"\x01q\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      fileOut(filePointers[uVar40 & 0xff]);
      return poVar11;
    }
    break;
  case 0x69:
    builtin_strncpy(acStack_80,",r\x10",4);
    acStack_80[4] = '\0';
    acStack_80[5] = '\0';
    acStack_80[6] = '\0';
    acStack_80[7] = '\0';
    iVar5 = snprintf((char *)0x0,0,"%s/lsteditXXXXXX",tmpdir);
    lVar35 = (long)iVar5;
    builtin_strncpy(acStack_80,"Qr\x10",4);
    acStack_80[4] = '\0';
    acStack_80[5] = '\0';
    acStack_80[6] = '\0';
    acStack_80[7] = '\0';
    info_impl("primitive",0x9d,"temporary file name size is %d",(ulong)(iVar5 + 1));
    lVar20 = -(lVar35 + 0x11U & 0xfffffffffffffff0);
    pcVar21 = local_78 + lVar20;
    pcVar23 = acStack_80 + lVar20;
    builtin_strncpy(acStack_80 + lVar20,"ur\x10",4);
    pcVar23[4] = '\0';
    pcVar23[5] = '\0';
    pcVar23[6] = '\0';
    pcVar23[7] = '\0';
    memset(pcVar21,0,lVar35 + 2U);
    pcVar24 = acStack_80 + lVar20;
    pcVar24[0] = -0x70;
    pcVar24[1] = 'r';
    pcVar24[2] = '\x10';
    pcVar24[3] = '\0';
    pcVar24[4] = '\0';
    pcVar24[5] = '\0';
    pcVar24[6] = '\0';
    pcVar24[7] = '\0';
    snprintf(pcVar21,lVar35 + 2U,"%s/lsteditXXXXXX",tmpdir);
    pcVar25 = acStack_80 + lVar20;
    pcVar25[0] = -0x57;
    pcVar25[1] = 'r';
    pcVar25[2] = '\x10';
    pcVar25[3] = '\0';
    pcVar25[4] = '\0';
    pcVar25[5] = '\0';
    pcVar25[6] = '\0';
    pcVar25[7] = '\0';
    info_impl("primitive",0xa4,"DEBUG: temp file name pattern: %s",pcVar21);
    pcVar26 = acStack_80 + lVar20;
    pcVar26[0] = -0x4f;
    pcVar26[1] = 'r';
    pcVar26[2] = '\x10';
    pcVar26[3] = '\0';
    pcVar26[4] = '\0';
    pcVar26[5] = '\0';
    pcVar26[6] = '\0';
    pcVar26[7] = '\0';
    iVar5 = mkstemp(pcVar21);
    if (iVar5 == -1) {
      pcVar27 = acStack_80 + lVar20;
      pcVar27[0] = -0x45;
      pcVar27[1] = 'r';
      pcVar27[2] = '\x10';
      pcVar27[3] = '\0';
      pcVar27[4] = '\0';
      pcVar27[5] = '\0';
      pcVar27[6] = '\0';
      pcVar27[7] = '\0';
      puVar9 = (uint *)__errno_location();
      uVar4 = *puVar9;
      pcVar28 = acStack_80 + lVar20;
      pcVar28[0] = -0x29;
      pcVar28[1] = 'r';
      pcVar28[2] = '\x10';
      pcVar28[3] = '\0';
      pcVar28[4] = '\0';
      pcVar28[5] = '\0';
      pcVar28[6] = '\0';
      pcVar28[7] = '\0';
      error_impl("primitive",0xa9,"error making temporary file name: errno=%d!",(ulong)uVar4);
    }
    pcVar29 = acStack_80 + lVar20;
    pcVar29[0] = -0x1a;
    pcVar29[1] = 'r';
    pcVar29[2] = '\x10';
    pcVar29[3] = '\0';
    pcVar29[4] = '\0';
    pcVar29[5] = '\0';
    pcVar29[6] = '\0';
    pcVar29[7] = '\0';
    pFVar10 = fopen(pcVar21,"w");
    if (pFVar10 == (FILE *)0x0) {
      pcVar30 = acStack_80 + lVar20;
      builtin_strncpy(acStack_80 + lVar20,"\vs\x10",4);
      pcVar30[4] = '\0';
      pcVar30[5] = '\0';
      pcVar30[6] = '\0';
      pcVar30[7] = '\0';
      error_impl("primitive",0xae,"cannot open temp edit file %s!",pcVar21);
    }
    _iStack_40 = args;
    puVar9 = (uint *)args[1].header;
    uVar4 = *puVar9;
    for (lVar39 = 0; uVar4 >> 2 != (uint)lVar39; lVar39 = lVar39 + 1) {
      bVar1 = *(byte *)((long)puVar9 + lVar39 + 0x10);
      pcVar31 = acStack_80 + lVar20;
      builtin_strncpy(acStack_80 + lVar20,"5s\x10",4);
      pcVar31[4] = '\0';
      pcVar31[5] = '\0';
      pcVar31[6] = '\0';
      pcVar31[7] = '\0';
      fputc((uint)bVar1,pFVar10);
    }
    pcVar32 = acStack_80 + lVar20;
    pcVar32[0] = '\n';
    pcVar32[1] = '\0';
    pcVar32[2] = '\0';
    pcVar32[3] = '\0';
    pcVar32[4] = '\0';
    pcVar32[5] = '\0';
    pcVar32[6] = '\0';
    pcVar32[7] = '\0';
    uVar2 = *(undefined8 *)(acStack_80 + lVar20);
    pcVar33 = acStack_80 + lVar20;
    builtin_strncpy(acStack_80 + lVar20,"Es\x10",4);
    pcVar33[4] = '\0';
    pcVar33[5] = '\0';
    pcVar33[6] = '\0';
    pcVar33[7] = '\0';
    fputc((int)uVar2,pFVar10);
    pcVar34 = acStack_80 + lVar20;
    builtin_strncpy(acStack_80 + lVar20,"Ms\x10",4);
    pcVar34[4] = '\0';
    pcVar34[5] = '\0';
    pcVar34[6] = '\0';
    pcVar34[7] = '\0';
    fclose(pFVar10);
    uVar40 = lVar35 + 0x14U & 0xfffffffffffffff0;
    lVar39 = -uVar40;
    pcVar22 = pcVar21 + lVar39;
    builtin_strncpy(local_78 + lVar39 + lVar20 + -8,"ss\x10",4);
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    memset(pcVar22,0,lVar35 + 5);
    builtin_strncpy(local_78 + (lVar20 - uVar40),"vi ",4);
    pcVar22[-8] = -0x76;
    pcVar22[-7] = 's';
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    strcat(pcVar22,pcVar21);
    pcVar22[-8] = -0x6e;
    pcVar22[-7] = 's';
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    iVar5 = system(pcVar22);
    if (iVar5 == -1) {
      pcVar22[-8] = -100;
      pcVar22[-7] = 's';
      pcVar22[-6] = '\x10';
      pcVar22[-5] = '\0';
      pcVar22[-4] = '\0';
      pcVar22[-3] = '\0';
      pcVar22[-2] = '\0';
      pcVar22[-1] = '\0';
      puVar9 = (uint *)__errno_location();
      uVar4 = *puVar9;
      pcVar22[-8] = -0x48;
      pcVar22[-7] = 's';
      pcVar22[-6] = '\x10';
      pcVar22[-5] = '\0';
      pcVar22[-4] = '\0';
      pcVar22[-3] = '\0';
      pcVar22[-2] = '\0';
      pcVar22[-1] = '\0';
      error_impl("primitive",0xc5,"error starting editor: %d!",(ulong)uVar4);
    }
    pcVar22[-8] = -0x39;
    pcVar22[-7] = 's';
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    pFVar10 = fopen(pcVar21,"r");
    if (pFVar10 == (FILE *)0x0) {
      pcVar22[-8] = -0x14;
      pcVar22[-7] = 's';
      pcVar22[-6] = '\x10';
      pcVar22[-5] = '\0';
      pcVar22[-4] = '\0';
      pcVar22[-3] = '\0';
      pcVar22[-2] = '\0';
      pcVar22[-1] = '\0';
      error_impl("primitive",0xcb,"cannot open temp edit file %s!",pcVar21);
    }
    uVar17 = 0;
    pcVar22[-8] = '\x02';
    pcVar22[-7] = '\0';
    pcVar22[-6] = '\0';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    uVar2 = *(undefined8 *)(pcVar22 + -8);
    pcVar22[-8] = -5;
    pcVar22[-7] = 's';
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    fseek(pFVar10,0,(int)uVar2);
    builtin_strncpy(local_78 + lVar39 + lVar20 + -8,"\x03t\x10",4);
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    uVar40 = ftell(pFVar10);
    builtin_strncpy(local_78 + lVar39 + lVar20 + -8,"\x0et\x10",4);
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    poVar11 = gcialloc((int)uVar40);
    poVar11->class = *(object **)(_iStack_40[1].header + 8);
    builtin_strncpy(local_78 + lVar39 + lVar20 + -8,"-t\x10",4);
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    fseek(pFVar10,0,0);
    uVar37 = 0;
    if (0 < (int)uVar40) {
      uVar37 = uVar40 & 0xffffffff;
    }
    for (; uVar37 != uVar17; uVar17 = uVar17 + 1) {
      builtin_strncpy(local_78 + lVar39 + lVar20 + -8,"Jt\x10",4);
      pcVar22[-4] = '\0';
      pcVar22[-3] = '\0';
      pcVar22[-2] = '\0';
      pcVar22[-1] = '\0';
      iVar5 = fgetc(pFVar10);
      *(char *)((long)&poVar11[1].header + uVar17) = (char)iVar5;
    }
    builtin_strncpy(local_78 + lVar39 + lVar20 + -8,"\\t\x10",4);
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    fclose(pFVar10);
    builtin_strncpy(local_78 + lVar39 + lVar20 + -8,"et\x10",4);
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    unlink(pcVar21);
    return poVar11;
  case 0x6a:
    uVar40 = args[1].header >> 1;
    if ((199 < (uint)uVar40) || ((FILE *)filePointers[uVar40 & 0xff] == (FILE *)0x0)) break;
    poVar11 = args[1].class;
    if (((poVar11->header & 2) == 0) ||
       (uVar4 = (uint)(args[2].header >> 1), ((uint)(poVar11->header >> 2) & 0x3fffffff) < uVar4))
    break;
    acStack_80[0] = -0x39;
    acStack_80[1] = 't';
    acStack_80[2] = '\x10';
    acStack_80[3] = '\0';
    acStack_80[4] = '\0';
    acStack_80[5] = '\0';
    acStack_80[6] = '\0';
    acStack_80[7] = '\0';
    sVar12 = fread(poVar11 + 1,1,(ulong)(uVar4 & 0x7fffffff),(FILE *)filePointers[uVar40 & 0xff]);
    iVar5 = (int)sVar12;
    goto LAB_001074c7;
  case 0x6b:
    uVar40 = args[1].header >> 1;
    if ((199 < (uint)uVar40) || ((FILE *)filePointers[uVar40 & 0xff] == (FILE *)0x0)) break;
    poVar11 = args[1].class;
    if (((poVar11->header & 2) == 0) ||
       (uVar4 = (uint)(args[2].header >> 1), ((uint)(poVar11->header >> 2) & 0x3fffffff) < uVar4))
    break;
    acStack_80[0] = -0x30;
    acStack_80[1] = 'q';
    acStack_80[2] = '\x10';
    acStack_80[3] = '\0';
    acStack_80[4] = '\0';
    acStack_80[5] = '\0';
    acStack_80[6] = '\0';
    acStack_80[7] = '\0';
    sVar12 = fwrite(poVar11 + 1,1,(ulong)(uVar4 & 0x7fffffff),(FILE *)filePointers[uVar40 & 0xff]);
    iVar5 = (int)sVar12;
LAB_001074c7:
    if (-1 < iVar5) {
      return (object *)((ulong)(uint)(iVar5 * 2) + 1);
    }
    break;
  case 0x6c:
    uVar40 = args[1].header >> 1;
    if ((((uint)uVar40 < 200) && ((FILE *)filePointers[uVar40 & 0xff] != (FILE *)0x0)) &&
       (((ulong)args[1].class >> 0x20 & 1) == 0)) {
      builtin_strncpy(acStack_80,"\x15u\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      iVar5 = fseek((FILE *)filePointers[uVar40 & 0xff],(ulong)args[1].class >> 1 & 0x7fffffff,0);
      if (-1 < iVar5) {
        return (object *)(ulong)(iVar5 * 2 + 1);
      }
    }
    break;
  default:
    switch(primitiveNumber) {
    case 0x96:
      poVar6 = (object *)args[1].header;
      uVar40 = poVar6->header;
      if ((uVar40 & 2) == 0) {
        pcVar21 = "#position: failed, first arg is not a binary object.";
      }
      else {
        uVar17 = (args[1].class)->header;
        if ((uVar17 & 2) != 0) {
          uVar4 = (uint)uVar40;
          if (uVar4 < 4) {
            return poVar11;
          }
          uVar3 = (uint)uVar17;
          if (uVar3 < 4) {
            return poVar11;
          }
          uVar4 = uVar4 >> 2;
          uVar3 = uVar3 >> 2;
          if (uVar4 < uVar3) {
            return poVar11;
          }
          lVar20 = -(ulong)(uVar4 + 0x10 & 0xfffffff0);
          pcVar22 = local_78 + lVar20;
          lVar35 = -(ulong)(uVar3 + 0x10 & 0xfffffff0);
          pcVar21 = pcVar22 + lVar35;
          pcVar21[-8] = -4;
          pcVar21[-7] = 'v';
          pcVar21[-6] = '\x10';
          pcVar21[-5] = '\0';
          pcVar21[-4] = '\0';
          pcVar21[-3] = '\0';
          pcVar21[-2] = '\0';
          pcVar21[-1] = '\0';
          getUnixString(pcVar22,uVar4 + 1,poVar6);
          poVar11 = args[1].class;
          builtin_strncpy(local_78 + lVar35 + lVar20 + -8,"\vw\x10",4);
          pcVar21[-4] = '\0';
          pcVar21[-3] = '\0';
          pcVar21[-2] = '\0';
          pcVar21[-1] = '\0';
          getUnixString(pcVar21,uVar3 + 1,poVar11);
          builtin_strncpy(local_78 + lVar35 + lVar20 + -8,"\x16w\x10",4);
          pcVar21[-4] = '\0';
          pcVar21[-3] = '\0';
          pcVar21[-2] = '\0';
          pcVar21[-1] = '\0';
          pcVar21 = strstr(pcVar22,pcVar21);
          if (pcVar21 == (char *)0x0) {
            return nilObject;
          }
          return (object *)(((long)pcVar21 - (long)pcVar22) * 2 + 3);
        }
        pcVar21 = "#position: failed, second arg is not a binary object.";
      }
      builtin_strncpy(acStack_80,"zu\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      puts(pcVar21);
      goto LAB_0010757a;
    case 0x97:
      poVar11 = (object *)args[1].header;
      uVar4 = (uint)poVar11->header >> 2;
      iVar5 = 0;
      for (uVar40 = 0; uVar4 != uVar40; uVar40 = uVar40 + 1) {
        acStack_80[0] = -0x2e;
        acStack_80[1] = 'o';
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        pvVar8 = memchr(";/?:@&=+!*\'(),$-_.<>#%\"\t\n\r",
                        (int)*(char *)((long)&poVar11[1].header + uVar40),0x1b);
        iVar5 = (iVar5 + 1) - (uint)(pvVar8 == (void *)0x0);
      }
      lVar20 = (long)rootTop;
      rootTop = rootTop + 1;
      rootStack[lVar20] = poVar11;
      iVar5 = uVar4 + iVar5 * 2;
      _iStack_40 = (object *)CONCAT44(iaddr.s_addr,iVar5);
      builtin_strncpy(acStack_80,"\x06p\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      poVar6 = gcialloc(iVar5);
      poVar6->class = StringClass;
      lVar20 = (long)rootTop;
      rootTop = rootTop + -1;
      poVar11 = (&oldTop)[lVar20];
      uVar40 = 0;
      iVar5 = 0;
      while( true ) {
        if (uVar4 <= uVar40) {
          return poVar6;
        }
        if (iStack_40 <= iVar5) break;
        cVar16 = *(char *)((long)&poVar11[1].header + uVar40);
        builtin_strncpy(acStack_80,"Op\x10",4);
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        pvVar8 = memchr(";/?:@&=+!*\'(),$-_.<>#%\"\t\n\r",(int)cVar16,0x1b);
        lVar20 = (long)iVar5;
        if (pvVar8 == (void *)0x0) {
          if (cVar16 == ' ') {
            cVar16 = '+';
          }
          iVar5 = iVar5 + 1;
          *(char *)((long)&poVar6[1].header + lVar20) = cVar16;
        }
        else {
          *(undefined1 *)((long)&poVar6[1].header + lVar20) = 0x25;
          *(char *)((long)&poVar6[1].header + lVar20 + 1) =
               "0123456789ABCDEF"[*(byte *)((long)&poVar11[1].header + uVar40) >> 4];
          iVar5 = iVar5 + 3;
          *(char *)((long)&poVar6[1].header + lVar20 + 2) =
               "0123456789ABCDEF"[*(byte *)((long)&poVar11[1].header + uVar40) & 0xf];
        }
        uVar40 = uVar40 + 1;
      }
      return poVar6;
    case 0x98:
      poVar11 = (object *)args[1].header;
      uVar4 = (uint)poVar11->header >> 2;
      iVar5 = 0;
      for (uVar40 = 0; uVar4 != uVar40; uVar40 = uVar40 + 1) {
        iVar5 = iVar5 + (uint)(*(char *)((long)&poVar11[1].header + uVar40) == '%');
      }
      lVar20 = (long)rootTop;
      rootTop = rootTop + 1;
      rootStack[lVar20] = poVar11;
      iVar5 = uVar4 + iVar5 * -2;
      uVar40 = 0;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      _iStack_40 = (object *)CONCAT44(iaddr.s_addr,iVar5);
      acStack_80[0] = -0x5a;
      acStack_80[1] = 'n';
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      poVar6 = gcialloc(iVar5);
      poVar6->class = StringClass;
      lVar20 = (long)rootTop;
      rootTop = rootTop + -1;
      poVar11 = (&oldTop)[lVar20];
      iVar5 = 0;
      iVar38 = 0;
      do {
        if (uVar4 <= uVar40) {
          return poVar6;
        }
        if (iStack_40 <= iVar38) {
          return poVar6;
        }
        cVar16 = *(char *)((long)&poVar11[1].header + uVar40);
        if (cVar16 == '+') {
          cVar16 = ' ';
        }
        iVar18 = iVar5;
        if (cVar16 == '%') {
          iVar18 = 3;
        }
        lVar20 = (long)iVar38;
        if (iVar18 == 1) {
          builtin_strncpy(acStack_80,"Uo\x10",4);
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          pp_Var7 = __ctype_toupper_loc();
          builtin_strncpy(acStack_80,"no\x10",4);
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          pvVar8 = memchr("0123456789ABCDEF",(*pp_Var7)[cVar16],0x11);
          iVar5 = (int)pvVar8 + -0x10965b;
          if (iVar5 < 0) {
LAB_00107678:
            ppoVar13 = &nilObject;
            goto LAB_00107901;
          }
          pcVar21 = (char *)((long)&poVar6[1].header + lVar20);
          *pcVar21 = *pcVar21 + (char)iVar5;
          iVar38 = iVar38 + 1;
          iVar5 = 0;
        }
        else if (iVar18 == 3) {
          iVar5 = 2;
        }
        else if (iVar18 == 2) {
          builtin_strncpy(acStack_80,"\x19o\x10",4);
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          pp_Var7 = __ctype_toupper_loc();
          builtin_strncpy(acStack_80,"2o\x10",4);
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          pvVar8 = memchr("0123456789ABCDEF",(*pp_Var7)[cVar16],0x11);
          iVar5 = (int)pvVar8 + -0x10965b;
          if (iVar5 < 0) goto LAB_00107678;
          *(char *)((long)&poVar6[1].header + lVar20) = (char)iVar5 << 4;
          iVar5 = 1;
        }
        else {
          iVar38 = iVar38 + 1;
          *(char *)((long)&poVar6[1].header + lVar20) = cVar16;
        }
        uVar40 = uVar40 + 1;
      } while( true );
    case 0x99:
    case 0x9a:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f:
switchD_00106d28_caseD_99:
      pcVar21 = "unknown primitive %d!";
      iVar5 = 0x247;
LAB_001070c7:
      acStack_80[0] = -0x32;
      acStack_80[1] = 'p';
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      error_impl("primitive",iVar5,pcVar21);
      return poVar11;
    case 0xa0:
      builtin_strncpy(acStack_80,"Bn\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      printf("Log: %.*s\n",(ulong)(*(uint *)args[1].header >> 2),(uint *)args[1].header + 4);
      *failed = 0;
      return nilObject;
    case 0xa1:
      builtin_strncpy(acStack_80,"\x16n\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      val = time_usec();
      builtin_strncpy(acStack_80,"\x1en\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      poVar11 = newLInteger(val);
      *failed = 0;
      return poVar11;
    default:
      if (primitiveNumber == 0xaa) {
        poVar11 = (object *)((long)&memoryPointer->header + (long)(prog_argc * -8 + -0x10));
        memoryPointer = poVar11;
        _iStack_40 = (object *)failed;
        if ((long)poVar11 < (long)memoryBase) {
          builtin_strncpy(acStack_80,"]u\x10",4);
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          poVar11 = gcollect(prog_argc);
        }
        else {
          poVar11->header = (ulong)(uint)(prog_argc << 2);
        }
        poVar11->class = ArrayClass;
        lVar20 = (long)rootTop;
        rootTop = rootTop + 1;
        uVar40 = (ulong)(uint)rootTop;
        rootStack[lVar20] = poVar11;
        for (lVar20 = 0; lVar20 < prog_argc; lVar20 = lVar20 + 1) {
          pcVar21 = prog_argv[lVar20];
          acStack_80[0] = -0xf;
          acStack_80[1] = 'u';
          acStack_80[2] = '\x10';
          acStack_80[3] = '\0';
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          sVar12 = strlen(pcVar21);
          acStack_80[0] = -4;
          acStack_80[1] = 'u';
          acStack_80[2] = '\x10';
          acStack_80[3] = '\0';
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          poVar11 = gcialloc((int)sVar12);
          poVar11->class = StringClass;
          uVar40 = sVar12 & 0xffffffff;
          if ((int)sVar12 < 1) {
            uVar40 = 0;
          }
          for (uVar17 = 0; uVar40 != uVar17; uVar17 = uVar17 + 1) {
            *(char *)((long)&poVar11[1].header + uVar17) = pcVar21[uVar17];
          }
          uVar40 = (ulong)rootTop;
          (&(&oldTop)[uVar40][1].header)[lVar20] = (uintptr_t)poVar11;
        }
        rootTop = (int)uVar40 + -1;
        poVar11 = (&oldTop)[(int)uVar40];
        *(int *)_iStack_40 = 0;
        return poVar11;
      }
      if (primitiveNumber != 200) goto switchD_00106d28_caseD_99;
    }
    switch(args[1].header >> 1 & 0xffffffff) {
    case 0:
      acStack_80[0] = -0x73;
      acStack_80[1] = 'm';
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      uVar4 = socket(2,1,0);
      if (uVar4 == 0xffffffff) {
        acStack_80[0] = -0x52;
        acStack_80[1] = 'm';
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        error_impl("primitive",0x1be,"Cannot open TCP socket.");
      }
      sin.sin_zero[0] = '\x01';
      sin.sin_zero[1] = '\0';
      sin.sin_zero[2] = '\0';
      sin.sin_zero[3] = '\0';
      acStack_80[0] = -0x37;
      acStack_80[1] = 'm';
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      iVar5 = setsockopt(uVar4,1,2,sin.sin_zero,4);
      if (iVar5 != 0) {
        acStack_80[0] = -0x2c;
        acStack_80[1] = 'm';
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        close(uVar4);
        acStack_80[0] = -0x12;
        acStack_80[1] = 'm';
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        error_impl("primitive",0x1c5,"Error setting socket reuse option!");
      }
      builtin_strncpy(acStack_80,"\nn\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      info_impl("primitive",0x1ca,"opened socket %d.",(ulong)uVar4);
      break;
    case 1:
      iVar38 = (int)((ulong)args[1].class >> 1);
      acStack_80[0] = -0x50;
      acStack_80[1] = 'w';
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      iVar5 = listen(iVar38,10);
      if (iVar5 == -1) {
        acStack_80[0] = -0x31;
        acStack_80[1] = 'w';
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        error_impl("primitive",0x1d4,"Error listening on TCP socket.");
      }
      local_78._0_4_ = 0x10;
      acStack_80[0] = -0x1c;
      acStack_80[1] = 'w';
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      uVar4 = accept(iVar38,(sockaddr *)sin.sin_zero,(socklen_t *)local_78);
      if (uVar4 == 0xffffffff) {
        acStack_80[0] = -0x10;
        acStack_80[1] = 'w';
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        puVar9 = (uint *)__errno_location();
        builtin_strncpy(acStack_80,"\fx\x10",4);
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        error_impl("primitive",0x1de,"Error accepting on TCP socket.  Errno=%d",(ulong)*puVar9);
      }
      break;
    case 2:
      uVar40 = (ulong)args[1].class >> 1;
      builtin_strncpy(acStack_80,"Kw\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      info_impl("primitive",0x1e8,"closing socket %d.",uVar40 & 0xffffffff);
      builtin_strncpy(acStack_80,"Rw\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      close((int)uVar40);
      goto LAB_001078fa;
    case 3:
      uVar40 = (ulong)args[1].class >> 1;
      to = sin.sin_zero;
      builtin_strncpy(acStack_80,"6x\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      getUnixString((char *)to,0x11,(object *)args[2].header);
      uVar17 = (ulong)args[2].class >> 1;
      builtin_strncpy(acStack_80,"\\x\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      info_impl("primitive",0x1f8,"Socket: %d",uVar40 & 0xffffffff);
      builtin_strncpy(acStack_80,"ux\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      info_impl("primitive",0x1f9,"IP: %s",to);
      acStack_80[0] = -0x72;
      acStack_80[1] = 'x';
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      info_impl("primitive",0x1fa,"Port: %d",uVar17 & 0xffffffff);
      acStack_80[0] = -0x66;
      acStack_80[1] = 'x';
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      iVar5 = inet_aton((char *)to,&local_44);
      if (iVar5 == 0) {
        acStack_80[0] = -0x48;
        acStack_80[1] = 'x';
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        error_impl("primitive",0x1fe,"Illegal address passed to bind primitive.");
      }
      uVar36 = (ushort)uVar17;
      local_78._2_2_ = uVar36 << 8 | uVar36 >> 8;
      local_78._0_2_ = 2;
      local_78._4_4_ = local_44.s_addr;
      acStack_80[0] = -0x25;
      acStack_80[1] = 'x';
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      iVar5 = bind((int)uVar40,(sockaddr *)local_78,0x10);
      if (iVar5 == -1) {
        acStack_80[0] = -6;
        acStack_80[1] = 'x';
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        error_impl("primitive",0x208,"Cannot bind TCP socket to address.");
      }
LAB_001078fa:
      ppoVar13 = &trueObject;
LAB_00107901:
      return *ppoVar13;
    default:
      pcVar21 = "Unknown socket primitive operation: %d!";
      iVar5 = 0x240;
      goto LAB_001070c7;
    case 7:
      poVar6 = args[1].class;
      for (lVar20 = 0; lVar20 != 0x400; lVar20 = lVar20 + 1) {
        socketReadBuffer[lVar20] = '\0';
      }
      builtin_strncpy(acStack_80,">y\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      uVar40 = read((int)((ulong)poVar6 >> 1),socketReadBuffer,0x400);
      iVar5 = (int)uVar40;
      if (iVar5 < 0) {
        builtin_strncpy(acStack_80,"Ky\x10",4);
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        piVar15 = __errno_location();
        if (*piVar15 != 0xb) {
          acStack_80[0] = -0x46;
          acStack_80[1] = 'y';
          acStack_80[2] = '\x10';
          acStack_80[3] = '\0';
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          info_impl("primitive",0x218,"socket read returned an error: %d (%d)!",uVar40 & 0xffffffff)
          ;
          goto LAB_0010757a;
        }
      }
      builtin_strncpy(acStack_80,"\\y\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      poVar11 = gcialloc(iVar5);
      poVar11->class = ByteArrayClass;
      uVar17 = 0;
      uVar40 = uVar40 & 0xffffffff;
      if (iVar5 < 1) {
        uVar40 = uVar17;
      }
      for (; uVar40 != uVar17; uVar17 = uVar17 + 1) {
        *(uint8_t *)((long)&poVar11[1].header + uVar17) = socketReadBuffer[uVar17];
      }
      return poVar11;
    case 8:
      builtin_strncpy(acStack_80,"pw\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      sVar14 = write((int)((ulong)args[1].class >> 1),(uint *)args[2].header + 4,
                     (ulong)(*(uint *)args[2].header >> 2));
      if ((int)sVar14 < 1) {
        return nilObject;
      }
      return (object *)((ulong)(uint)((int)sVar14 * 2) + 1);
    }
LAB_0010780f:
    return (object *)((long)(int)uVar4 * 2 + 1);
  }
LAB_0010757a:
  *failed = 1;
  return poVar11;
}

Assistant:

struct object *primitive(int primitiveNumber, struct object *args, int *failed)
{
    struct object *returnedValue = nilObject;
    int i, j;
    int rc;
    FILE *fp;
    uint8_t *p;
    struct byteObject *stringReturn;
    //char nameBuffer[80], modeBuffer[80];
    int subPrim=0;
    char netBuffer[18];
    struct sockaddr myAddr;
    struct sockaddr_in sin;
    struct in_addr iaddr;
    socklen_t myAddrSize;
    int sock;
    int sock_opt;
    int port;
    struct byteObject *ba;


    *failed = 0;
    switch(primitiveNumber) {
    case 100:
    {
        /* open a file */
        int pathSize = SIZE(args->data[0]) + 1;
        char *pathBuffer = (char *)alloca((size_t)pathSize);
        int modeSize = SIZE(args->data[1]) + 1;
        char *modeBuffer = (char *)alloca((size_t)modeSize);

        getUnixString(pathBuffer, pathSize, args->data[0]);
        getUnixString(modeBuffer, modeSize, args->data[1]);

        fp = fopen(pathBuffer, modeBuffer);
        if (fp != NULL) {
            for (i = 0; i < FILEMAX; ++i) {
                if (filePointers[i] == NULL) {
                    break;
                }
            }
            if (i >= FILEMAX) {
                error("too many open files");
            } else {
                returnedValue = newInteger(i);
                filePointers[i] = fp;
            }
        } else {
            *failed = 1;
        }
    }

    break;

    case 101:	/* read a single character from a file */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        i = fgetc(fp);
        if (i != EOF) {
            returnedValue = newInteger(i);
        }
        break;

    case 102:	/* write a single character to a file */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        fputc(integerValue(args->data[1]), fp);
        break;

    case 103:	/* close file */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        fclose(fp);
        break;

    case 104:	/* file out image */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        fileOut(fp);
        break;

    case 105:
    {
        /* edit a string */
        char *tmpFileName = NULL;
        size_t tmpFileNameSize = 0;

        /* first get the size needed for the temporary path */
        tmpFileNameSize = (size_t)snprintf(tmpFileName, 0, "%s/lsteditXXXXXX", tmpdir) + 1;

        info("temporary file name size is %d", (int)tmpFileNameSize);

        /* allocate it on the stack and write the string into it. */
        tmpFileName = (char *)alloca((size_t)tmpFileNameSize + 1);
        memset(tmpFileName, 0, tmpFileNameSize + 1);
        snprintf(tmpFileName, tmpFileNameSize + 1, "%s/lsteditXXXXXX", tmpdir);

        info("DEBUG: temp file name pattern: %s",tmpFileName);

        rc = mkstemp(tmpFileName);
        /* copy string to file */
        if(rc == -1) {
            error("error making temporary file name: errno=%d!", errno);
        }

        fp = fopen(tmpFileName, "w");
        if (fp == NULL) {
            error("cannot open temp edit file %s!", tmpFileName);
        }

        j = SIZE(args->data[0]);
        p = ((struct byteObject *) args->data[0])->bytes;

        for (i = 0; i < j; i++) {
            fputc(*p++, fp);
        }
        fputc('\n', fp);

        fclose(fp);

        /* call the editor */
        size_t cmdBufSize = tmpFileNameSize + strlen("vi ");
        char *cmdBuf = (char*)alloca(cmdBufSize + 1);
        memset(cmdBuf, 0, cmdBufSize + 1);

        strcpy(cmdBuf,"vi ");
        strcat(cmdBuf, tmpFileName);
        rc = system(cmdBuf);

        if(rc == -1) {
            error("error starting editor: %d!",(int)errno);
        }

        /* copy back to new string */
        fp = fopen(tmpFileName, "r");
        if (fp == NULL) {
            error("cannot open temp edit file %s!", tmpFileName);
        }

        /* get length of file */
        fseek(fp, 0, 2);
        j = (int) ftell(fp);

        returnedValue = (struct object *)(stringReturn = (struct byteObject *)gcialloc(j));
        returnedValue->class = args->data[0]->class;

        /* reset to beginning, and read values */
        fseek(fp, 0, 0);

        /* FIXME - check for EOF! */
        for (i = 0; i < j; i++) {
            stringReturn->bytes[i] = (uint8_t)fgetc(fp);
        }
        /* now clean up files */
        fclose(fp);
        unlink(tmpFileName);
    }

    break;

    case 106:	/* Read into ByteArray */
        /* File descriptor */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }

        /* Make sure we're populating an array of bytes */
        returnedValue = args->data[1];
        if (!IS_BINOBJ(returnedValue)) {
            *failed = 1;
            break;
        }

        /* Sanity check on I/O count */
        i = integerValue(args->data[2]);
        if ((i < 0) || (i > (int)SIZE(returnedValue))) {
            *failed = 1;
            break;
        }

        /* Do the I/O */
        i = (int)fread(bytePtr(returnedValue), sizeof(char), (size_t)i, fp);
        if (i < 0) {
            *failed = 1;
            break;
        }
        returnedValue = newInteger(i);
        break;

    case 107:	/* Write from ByteArray */
        /* File descriptor */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }

        /* Make sure we're writing an array of bytes */
        returnedValue = args->data[1];
        if (!IS_BINOBJ(returnedValue)) {
            *failed = 1;
            break;
        }

        /* Sanity check on I/O count */
        i = integerValue(args->data[2]);
        if ((i < 0) || (i > (int)SIZE(returnedValue))) {
            *failed = 1;
            break;
        }

        /* Do the I/O */
        i = (int)fwrite(bytePtr(returnedValue), sizeof(char), (size_t)i, fp);
        if (i < 0) {
            *failed = 1;
            break;
        }
        returnedValue = newInteger(i);
        break;

    case 108:	/* Seek to file position */
        /* File descriptor */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }

        /* File position */
        i = integerValue(args->data[1]);
        if ((i < 0) || ((i = fseek(fp, i, SEEK_SET)) < 0)) {
            *failed = 1;
            break;
        }

        /* Return position as our value */
        returnedValue = newInteger(i);
        break;


    case 150:	/* match substring in a string. Return index of substring or fail. */
        /* make sure we've got strings */
        if(!IS_BINOBJ(args->data[0])) {
            printf("#position: failed, first arg is not a binary object.\n");
            *failed = 1;
            break;
        }

        if(!IS_BINOBJ(args->data[1])) {
            printf("#position: failed, second arg is not a binary object.\n");
            *failed = 1;
            break;
        }

        /* get the sizes of the strings */
        i = SIZE(args->data[0]);
        j = SIZE(args->data[1]);

        /*
         * don't bother to compare if either string has a zero length
         * or the second string is longer than the first
         */

        if((i > 0) && (j > 0) && (i>=j)) {
            /* using alloca to make sure that the memory is freed automatically */
            char *p = (char *)alloca((size_t)i+1);
            char *q = (char *)alloca((size_t)j+1);
            char *r = (char *)0;

            getUnixString(p,i+1,args->data[0]);
            getUnixString(q,j+1,args->data[1]);

            /* find the pointer to the substring */
            r = strstr(p,q);

            if(r != NULL) {
                /* the string was found */
                returnedValue = newInteger((r-p)+1);
            } else {
                returnedValue = nilObject;
            }

            /* success */
            break;
        } else {
            if((i<0) || (j<0)) {
                printf("#position: failed due to unusable string sizes, string 1 size %d, string 2 size %d.\n", i, j);
            } else {
                /* i==0 or j==0 or i<j in which case we have no match but no error. */
                returnedValue = nilObject;
                break;
            }
        }

        /* if we get here, we've failed */
        *failed = 1;
        break;

    case 151: /* convert a string to URL encoding, returns nil or string */
        returnedValue = stringToUrl((struct byteObject *)args->data[0]);

        break;


    case 152: /* convert a string from URL encoding, returns nil or string */
        returnedValue = urlToString((struct byteObject *)args->data[0]);

        break;

    /* large timestamps */
    case 160: /* print out a microsecond timestamp and message string. */
        {
            struct byteObject *msg = (struct byteObject *)(args->data[0]);

            printf("Log: %.*s\n", SIZE(msg), bytePtr(msg));

            *failed = 0;

            returnedValue = nilObject;
        }

        break;

    case 161: /* return an Integer with the microsecond timestamp. */
        returnedValue = newLInteger(time_usec());
        *failed = 0;
        break;

    case 170: /* get argv strings as an Array of Strings. */
        {
            struct object *argv_array = NULL;

            /* allocate enough space for the result Array. */
            argv_array = gcalloc(prog_argc);
            argv_array->class = ArrayClass;

            /* we are going to allocate Strings and that could cause GC. */
            PUSH_ROOT(argv_array);

            for(int index = 0; index < prog_argc; index++) {
                struct object *argv_entry = NULL;
                const char *argv_str = prog_argv[index];
                int str_len = (int)strlen(argv_str);

                /* could cause GC */
                argv_entry = gcialloc(str_len);
                argv_entry->class = StringClass;

                /* copy the bytes. */
                for(int i=0; i < str_len; i++) {
                    bytePtr(argv_entry)[i] = (uint8_t)argv_str[i];
                }

                /* get the pointer to the array again.   Could have changed due to GC. */
                argv_array = PEEK_ROOT();

                argv_array->data[index] = argv_entry;
            }

            argv_array = POP_ROOT();

            returnedValue = argv_array;

            *failed = 0;
        }

        break;

    case 200: /* this is a set of primitives for socket handling */
        subPrim = integerValue(args->data[0]);

        /* 200-250 socket handling */
        switch(subPrim) {
        case 0: /* open a TCP socket */
            sock = socket(PF_INET,SOCK_STREAM,0);

            if(sock == -1) {
                error("Cannot open TCP socket.");
            }

            sock_opt = 1;

            if(setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&sock_opt, sizeof(sock_opt))) {
                close(sock);
                error("Error setting socket reuse option!");
            }

            /* return the value anyway */

            info("opened socket %d.", sock);

            returnedValue = newInteger(sock);

            break;

        case 1: /* accept on a socket */
            sock = integerValue(args->data[1]);

            if(listen(sock, 10) == -1) {
                error("Error listening on TCP socket.");
            }

            /* set the maximum size */
            myAddrSize = sizeof(myAddr);

            /* printf("accept(%d, %p, %d)\n", sock, &myAddr, myAddrSize); */

            sock = accept(sock, &myAddr, &myAddrSize);
            if(sock == -1) {
                error("Error accepting on TCP socket.  Errno=%d", errno);
            }

            returnedValue = newInteger(sock);

            break;

        case 2: /* close a socket */
            sock = integerValue(args->data[1]);

            info("closing socket %d.", sock);

            close(sock);

            returnedValue = trueObject;

            break;

        case 3: /* bind a socket to an address and port */
            /* this takes three arguments, the socket fd,
            the address (as a dotted-notation string) and
            the port as an integer */
            sock = integerValue(args->data[1]);
            getUnixString(netBuffer, sizeof(netBuffer)-1, args->data[2]);
            port = integerValue(args->data[3]);

            info("Socket: %d",sock);
            info("IP: %s",netBuffer);
            info("Port: %d",port);

            /* convert the string IP to a network representation */
            if(inet_aton((const char *)netBuffer,&iaddr) == 0) {
                error("Illegal address passed to bind primitive.");
            }

            /* build a sockaddr_in struct */
            sin.sin_family = AF_INET;
            sin.sin_port = htons((u_int16_t)port);
            /*			sin.sin_port = (u_int16_t)0;*/
            sin.sin_addr = iaddr;

            if(bind(sock,(struct sockaddr *)&sin,sizeof(sin)) == -1) {
                error("Cannot bind TCP socket to address.");
            }

            returnedValue = trueObject;

            break;

        case 7: /* read from a TCP socket.  This returns a byte array. */
            sock = integerValue(args->data[1]);

            for(i=0; i<SOCK_BUF_SIZE; i++) {
                socketReadBuffer[i]=(char)0;
            }

            i = (int)read(sock,(void *)socketReadBuffer,(size_t)SOCK_BUF_SIZE);
            if((i < 0) && (errno != EAGAIN) && (errno != EWOULDBLOCK)) {
                info("socket read returned an error: %d (%d)!", i, errno);
                *failed = 1;
                break;
            }

//            printf("Read: %s\n",socketReadBuffer);

            ba = (struct byteObject *)gcialloc(i);
            ba->class = ByteArrayClass;

            /* copy data into the new ByteArray */
            for(j=0; j<i; j++) {
                bytePtr(ba)[j] = socketReadBuffer[j];
            }

            returnedValue = (struct object *)ba;

            break;

        case 8: /* write to a socket, args: sock, data */
            sock = integerValue(args->data[1]);
            p = (uint8_t *)bytePtr(args->data[2]);
            i = SIZE(args->data[2]);

            /*printf("Writing: ");
            snprintf(socketReadBuffer,i,"%s",p);
            socketReadBuffer[i] = (char)0;
            printf("%s\n",socketReadBuffer);
            */

            j = (int)write(sock,(void *)p,(size_t)i);

            if(j>0)
                returnedValue = newInteger(j);
            else
                returnedValue = nilObject;

            break;

        default: /* unknown socket primitive */
            error("Unknown socket primitive operation: %d!",subPrim);
            break;
        }

        break;

    default:
        error("unknown primitive %d!", primitiveNumber);
    }
    return(returnedValue);
}